

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Table_Equality3_Test::TestBody(Table_Equality3_Test *this)

{
  StringTable *val2;
  long lVar1;
  pointer *__ptr;
  char *message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  v2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  v1;
  StringTable u;
  StringTable t;
  undefined1 local_138 [24];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_120;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  local_f8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  local_48;
  
  val2 = (StringTable *)local_138;
  local_48.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  local_48.ctrl_ = (ctrl_t *)0x0;
  local_48.slots_ = (slot_type *)0x0;
  local_48.size_ = 0;
  local_48.capacity_ = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,(char (*) [2])0x181e4d,(char (*) [2])0x181e4d);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_88,(char (*) [3])"bb",(char (*) [3])"bb");
  __l._M_len = 2;
  __l._M_array = (iterator)local_c8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_110,__l,(allocator_type *)&local_f8);
  lVar1 = -0x80;
  paVar2 = &local_88.second.field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    if (&paVar2->_M_allocated_capacity + -4 != (size_type *)(&paVar2->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-6],
                      (&paVar2->_M_allocated_capacity)[-4] + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -8);
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            (&local_48,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_110.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_110.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_f8.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  local_f8.ctrl_ = (ctrl_t *)0x0;
  local_f8.slots_ = (slot_type *)0x0;
  local_f8.size_ = 0;
  local_f8.capacity_ = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,(char (*) [2])0x191ba8,(char (*) [2])0x191ba8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_88,(char (*) [3])"aa",(char (*) [3])"aa");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_c8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_138 + 0x10),__l_00,(allocator_type *)local_138);
  lVar1 = -0x80;
  paVar2 = &local_88.second.field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    if (&paVar2->_M_allocated_capacity + -4 != (size_type *)(&paVar2->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-6],
                      (&paVar2->_M_allocated_capacity)[-4] + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -8);
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            (&local_f8,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_138._16_8_,local_120);
  testing::internal::
  CmpHelperNE<phmap::priv::(anonymous_namespace)::StringTable,phmap::priv::(anonymous_namespace)::StringTable>
            (local_c8,(char *)&local_f8,(StringTable *)&local_48,val2);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_138 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x5e9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_138 + 8),(Message *)local_138)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_138 + 8));
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_138 + 0x10));
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots(&local_f8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_110);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots(&local_48);
  return;
}

Assistant:

TEST(Group, MatchEmptyOrDeleted) {
  PHMAP_IF_CONSTEXPR (Group::kWidth == 16) {
    ctrl_t group[] = {kEmpty, 1, kDeleted, 3, kEmpty, 5, kSentinel, 7,
                      7,      5, 3,        1, 1,      1, 1,         1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 2, 4));
  } else PHMAP_IF_CONSTEXPR (Group::kWidth == 8) {
    ctrl_t group[] = {kEmpty, 1, 2, kDeleted, 2, 1, kSentinel, 1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 3));
  } else {
    FAIL() << "No test coverage for Group::kWidth==" << Group::kWidth;
  }